

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void __thiscall zsummer::log4z::CSem::~CSem(CSem *this)

{
  CSem *this_local;
  
  this->_vptr_CSem = (_func_int **)&PTR__CSem_00155cc8;
  if ((this->m_bCreate & 1U) != 0) {
    this->m_bCreate = false;
    sem_destroy((sem_t *)&this->m_semid);
  }
  return;
}

Assistant:

virtual ~CSem()
	{
#ifdef WIN32
		if (m_hSem != NULL)
		{
			CloseHandle(m_hSem);
			m_hSem = NULL;
		}
#else
		if (m_bCreate)
		{
			m_bCreate = false;
			sem_destroy(&m_semid);
		}
#endif
	}